

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int kwsysProcessesAdd(cmsysProcess *cp)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int local_dc;
  undefined1 local_d8 [8];
  sigaction newSigChldAction;
  kwsysProcessInstances newProcesses;
  kwsysProcessInstances oldProcesses;
  int p [2];
  cmsysProcess *cp_local;
  
  iVar1 = pipe((int *)&oldProcesses.Processes);
  if (iVar1 < 0) {
    cp_local._4_4_ = 0;
  }
  else {
    cp->PipeReadEnds[2] = (int)oldProcesses.Processes;
    cp->SignalPipe = oldProcesses.Processes._4_4_;
    iVar1 = kwsysProcessSetNonBlocking((int)oldProcesses.Processes);
    if ((iVar1 == 0) ||
       (iVar1 = kwsysProcessSetNonBlocking(oldProcesses.Processes._4_4_), iVar1 == 0)) {
      cp_local._4_4_ = 0;
    }
    else {
      iVar1 = fcntl64((int)oldProcesses.Processes,2,1);
      if ((iVar1 < 0) || (iVar1 = fcntl64(oldProcesses.Processes._4_4_,2,1), iVar1 < 0)) {
        cp_local._4_4_ = 0;
      }
      else {
        oldProcesses._0_8_ = kwsysProcesses.Processes;
        newSigChldAction.sa_restorer = (_func_void *)kwsysProcesses._0_8_;
        newProcesses._0_8_ = kwsysProcesses.Processes;
        newProcesses.Processes._0_4_ = kwsysProcesses.Count;
        newProcesses.Processes._4_4_ = kwsysProcesses.Size;
        if ((int)newProcesses.Processes == newProcesses.Processes._4_4_) {
          if (newProcesses.Processes._4_4_ == 0) {
            local_dc = 4;
          }
          else {
            local_dc = newProcesses.Processes._4_4_ << 1;
          }
          newSigChldAction.sa_restorer =
               (_func_void *)CONCAT44(local_dc,(int)newProcesses.Processes);
          newProcesses._0_8_ = malloc((long)local_dc << 3);
          if ((void *)newProcesses._0_8_ == (void *)0x0) {
            return 0;
          }
          if (0 < (int)newProcesses.Processes) {
            memcpy((void *)newProcesses._0_8_,(void *)oldProcesses._0_8_,
                   (long)(int)newProcesses.Processes << 3);
          }
        }
        iVar1 = (int)newSigChldAction.sa_restorer;
        newSigChldAction.sa_restorer =
             (_func_void *)
             CONCAT44(newSigChldAction.sa_restorer._4_4_,(int)newSigChldAction.sa_restorer + 1);
        *(cmsysProcess **)(newProcesses._0_8_ + (long)iVar1 * 8) = cp;
        kwsysProcessesUpdate((kwsysProcessInstances *)&newSigChldAction.sa_restorer);
        if (newProcesses._0_8_ != oldProcesses._0_8_) {
          free((void *)oldProcesses._0_8_);
        }
        if ((int)newSigChldAction.sa_restorer == 1) {
          memset(local_d8,0,0x98);
          local_d8 = (undefined1  [8])kwsysProcessesSignalHandler;
          newSigChldAction.sa_mask.__val[0xf]._0_4_ = 0x10000005;
          do {
            iVar1 = sigaction(0x11,(sigaction *)local_d8,
                              (sigaction *)&kwsysProcessesOldSigChldAction);
            bVar3 = false;
            if (iVar1 < 0) {
              piVar2 = __errno_location();
              bVar3 = *piVar2 == 4;
            }
          } while (bVar3);
        }
        cp_local._4_4_ = 1;
      }
    }
  }
  return cp_local._4_4_;
}

Assistant:

static int kwsysProcessesAdd(kwsysProcess* cp)
{
  /* Create a pipe through which the signal handler can notify the
     given process object that a child has exited.  */
  {
  /* Create the pipe.  */
  int p[2];
  if(pipe(p KWSYSPE_VMS_NONBLOCK) < 0)
    {
    return 0;
    }

  /* Store the pipes now to be sure they are cleaned up later.  */
  cp->PipeReadEnds[KWSYSPE_PIPE_SIGNAL] = p[0];
  cp->SignalPipe = p[1];

  /* Switch the pipe to non-blocking mode so that reading a byte can
     be an atomic test-and-set.  */
  if(!kwsysProcessSetNonBlocking(p[0]) ||
     !kwsysProcessSetNonBlocking(p[1]))
    {
    return 0;
    }

  /* The children do not need this pipe.  Set close-on-exec flag on
     the pipe's ends.  */
  if((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
     (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0))
    {
    return 0;
    }
  }

  /* Attempt to add the given signal pipe to the signal handler set.  */
  {

  /* Make sure there is enough space for the new signal pipe.  */
  kwsysProcessInstances oldProcesses = kwsysProcesses;
  kwsysProcessInstances newProcesses = oldProcesses;
  if(oldProcesses.Count == oldProcesses.Size)
    {
    /* Start with enough space for a small number of process instances
       and double the size each time more is needed.  */
    newProcesses.Size = oldProcesses.Size? oldProcesses.Size*2 : 4;

    /* Try allocating the new block of memory.  */
    if((newProcesses.Processes = ((kwsysProcess**)
                                  malloc((size_t)(newProcesses.Size)*
                                         sizeof(kwsysProcess*)))))
      {
      /* Copy the old pipe set to the new memory.  */
      if(oldProcesses.Count > 0)
        {
        memcpy(newProcesses.Processes, oldProcesses.Processes,
               ((size_t)(oldProcesses.Count) * sizeof(kwsysProcess*)));
        }
      }
    else
      {
      /* Failed to allocate memory for the new signal pipe set.  */
      return 0;
      }
    }

  /* Append the new signal pipe to the set.  */
  newProcesses.Processes[newProcesses.Count++] = cp;

  /* Store the new set in that seen by the signal handler.  */
  kwsysProcessesUpdate(&newProcesses);

  /* Free the original pipes if new ones were allocated.  */
  if(newProcesses.Processes != oldProcesses.Processes)
    {
    free(oldProcesses.Processes);
    }

  /* If this is the first process, enable the signal handler.  */
  if(newProcesses.Count == 1)
    {
    /* Install our handler for SIGCHLD.  Repeat call until it is not
       interrupted.  */
    struct sigaction newSigChldAction;
    memset(&newSigChldAction, 0, sizeof(struct sigaction));
#if KWSYSPE_USE_SIGINFO
    newSigChldAction.sa_sigaction = kwsysProcessesSignalHandler;
    newSigChldAction.sa_flags = SA_NOCLDSTOP | SA_SIGINFO;
# ifdef SA_RESTART
    newSigChldAction.sa_flags |= SA_RESTART;
# endif
#else
    newSigChldAction.sa_handler = kwsysProcessesSignalHandler;
    newSigChldAction.sa_flags = SA_NOCLDSTOP;
#endif
    while((sigaction(SIGCHLD, &newSigChldAction,
                     &kwsysProcessesOldSigChldAction) < 0) &&
          (errno == EINTR));
    }
  }

  return 1;
}